

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void __thiscall
Variable_addDuplicateEquivalentVariablesAndCount_Test::TestBody
          (Variable_addDuplicateEquivalentVariablesAndCount_Test *this)

{
  char cVar1;
  char *pcVar2;
  VariablePtr v1;
  VariablePtr v2;
  AssertionResult gtest_ar;
  size_t e;
  size_t a;
  long *local_60;
  AssertHelper local_58 [8];
  shared_ptr local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  unsigned_long local_20;
  unsigned_long local_18;
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::addEquivalence(local_50,local_40);
  libcellml::Variable::addEquivalence(local_50,local_40);
  libcellml::Variable::addEquivalence(local_40,local_50);
  libcellml::Variable::addEquivalence(local_40,local_50);
  local_20 = 1;
  local_18 = libcellml::Variable::equivalentVariableCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>(local_30,"e","a",&local_20,&local_18);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if (local_60 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_60 != (long *)0x0)) {
        (**(code **)(*local_60 + 8))();
      }
      local_60 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

TEST(Variable, addDuplicateEquivalentVariablesAndCount)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v2, v1);
    libcellml::Variable::addEquivalence(v2, v1);
    const size_t e = 1;
    size_t a = v1->equivalentVariableCount();
    EXPECT_EQ(e, a);
}